

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::string_maker<std::optional<long>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,string_maker<std::optional<long>> *this,
          optional<long> *value)

{
  ostream *os_00;
  ostringstream local_190 [8];
  ostringstream os;
  optional<long> *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  os_00 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
  lest::operator<<(os_00,(optional<long> *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }